

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

void Gia_ObjSetMuxLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  int Fill;
  int Fill_00;
  Gia_Obj_t *pGVar7;
  int iVar8;
  
  pGVar3 = p->pObjs;
  if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
    if ((p->pMuxes == (uint *)0x0) ||
       (p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] == 0)) {
      __assert_fail("Gia_ObjIsMux(p,pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x23e,"void Gia_ObjSetMuxLevel(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar6 = (uint)*(undefined8 *)pObj & 0x1fffffff;
    pGVar7 = pObj + -(ulong)uVar6;
    if ((pGVar3 <= pGVar7) && (pGVar7 < pGVar3 + p->nObjs)) {
      uVar5 = (int)((long)pGVar7 - (long)pGVar3 >> 2) * -0x55555555;
      pVVar4 = p->vLevels;
      Vec_IntFillExtra(pVVar4,uVar5 + 1,uVar6 * -3);
      if (((int)uVar5 < 0) || (pVVar4->nSize <= (int)uVar5)) {
LAB_004e912b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pGVar3 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar7 = p->pObjs;
      if ((pGVar7 <= pGVar3) && (pGVar3 < pGVar7 + p->nObjs)) {
        iVar1 = pVVar4->pArray[uVar5 & 0x7fffffff];
        uVar6 = (int)((long)pGVar3 - (long)pGVar7 >> 2) * -0x55555555;
        pVVar4 = p->vLevels;
        Vec_IntFillExtra(pVVar4,uVar6 + 1,Fill);
        if (((int)uVar6 < 0) || (pVVar4->nSize <= (int)uVar6)) goto LAB_004e912b;
        iVar8 = pVVar4->pArray[uVar6 & 0x7fffffff];
        pGVar3 = p->pObjs;
        if (p->pMuxes == (uint *)0x0) {
          pGVar7 = (Gia_Obj_t *)0x0;
          uVar6 = 0;
        }
        else {
          if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) goto LAB_004e910c;
          uVar6 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555];
          if ((int)uVar6 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar6 = uVar6 >> 1;
          if (p->nObjs <= (int)uVar6) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar7 = pGVar3 + uVar6;
        }
        if ((pGVar3 <= pGVar7) && (pGVar7 < pGVar3 + p->nObjs)) {
          uVar5 = (int)((long)pGVar7 - (long)pGVar3 >> 2) * -0x55555555;
          pVVar4 = p->vLevels;
          Vec_IntFillExtra(pVVar4,uVar5 + 1,uVar6);
          if (((int)uVar5 < 0) || (pVVar4->nSize <= (int)uVar5)) goto LAB_004e912b;
          pGVar3 = p->pObjs;
          if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
            iVar2 = pVVar4->pArray[uVar5 & 0x7fffffff];
            uVar6 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,uVar6 + 1,Fill_00);
            if ((-1 < (int)uVar6) && ((int)uVar6 < pVVar4->nSize)) {
              if (iVar8 < iVar1) {
                iVar8 = iVar1;
              }
              if (iVar8 <= iVar2) {
                iVar8 = iVar2;
              }
              pVVar4->pArray[uVar6 & 0x7fffffff] = iVar8 + 2;
              return;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
        }
      }
    }
  }
LAB_004e910c:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int          Gia_ObjId( Gia_Man_t * p, Gia_Obj_t * pObj )        { assert( p->pObjs <= pObj && pObj < p->pObjs + p->nObjs ); return pObj - p->pObjs; }